

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
net_tests::anon_unknown_17::V2TransportTester::ReceivePacket
          (V2TransportTester *this,Span<const_std::byte> aad)

{
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  bool bVar1;
  uint32_t uVar2;
  const_iterator __first;
  byte *pbVar3;
  const_string *file;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> aad_00;
  Span<std::byte> SVar4;
  bool ret;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *contents;
  bool ignore;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffce8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *this_00;
  lazy_ostream *in_stack_fffffffffffffcf0;
  BIP324Cipher *in_stack_fffffffffffffcf8;
  size_type in_stack_fffffffffffffd00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd08;
  lazy_ostream *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  bool *line_num;
  const_string *in_stack_fffffffffffffd20;
  lazy_ostream *in_stack_fffffffffffffd28;
  size_t in_stack_fffffffffffffd30;
  const_iterator __last;
  size_t in_stack_fffffffffffffda0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  size_t in_stack_fffffffffffffdc8;
  lazy_ostream local_1d8 [2];
  assertion_result local_1b8 [2];
  lazy_ostream *local_178;
  const_string local_128 [2];
  lazy_ostream local_108 [2];
  assertion_result local_e8 [3];
  Span<unsigned_char> local_a0;
  const_string local_90 [2];
  lazy_ostream local_70 [2];
  assertion_result local_50 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar5 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffce8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
               (pointer)in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,(const_string *)in_stack_fffffffffffffd10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffce8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffcf8,
               SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
               (pointer)in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffcf0,(basic_cstring<const_char> *)in_stack_fffffffffffffce8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
               (pointer)in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffce8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_50,local_70,local_90,0x4c1,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffce8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffce8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  __first._M_current = (uchar *)(in_RSI + 0x5b0);
  Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<unsigned_char> *)in_stack_fffffffffffffcf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8);
  local_a0 = Span<unsigned_char>::first
                       ((Span<unsigned_char> *)in_stack_fffffffffffffcf8,
                        (size_t)in_stack_fffffffffffffcf0);
  aad_00 = MakeByteSpan<Span<unsigned_char>>((Span<unsigned_char> *)in_stack_fffffffffffffcf8);
  input.m_size = in_stack_fffffffffffffd30;
  input.m_data = (byte *)in_stack_fffffffffffffd28;
  uVar2 = BIP324Cipher::DecryptLength(in_stack_fffffffffffffcf8,input);
  pbVar3 = (byte *)(ulong)uVar2;
  do {
    __last._M_current = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
               (pointer)in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,(const_string *)in_stack_fffffffffffffd10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffce8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffcf8,
               SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
    in_stack_fffffffffffffd28 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
               (pointer)in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffcf0,(basic_cstring<const_char> *)in_stack_fffffffffffffce8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
               (pointer)in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffce8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e8,local_108,local_128,0x4c5,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffce8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffce8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  file = (const_string *)(in_RSI + 0x5b0);
  Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<unsigned_char> *)in_stack_fffffffffffffcf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8);
  Span<unsigned_char>::first
            ((Span<unsigned_char> *)in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
  Span<unsigned_char>::subspan
            ((Span<unsigned_char> *)in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
  MakeByteSpan<Span<unsigned_char>>((Span<unsigned_char> *)in_stack_fffffffffffffcf8);
  SVar4 = MakeWritableByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffcf8);
  this_00 = (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
             *)SVar4.m_data;
  local_178 = (lazy_ostream *)SVar4.m_size;
  input_00.m_size = in_stack_fffffffffffffda0;
  input_00.m_data = pbVar3;
  SVar4.m_size = in_stack_fffffffffffffdc8;
  SVar4.m_data = (byte *)pvVar5;
  BIP324Cipher::Decrypt
            ((BIP324Cipher *)__first._M_current,input_00,aad_00,(bool *)__last._M_current,SVar4);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,(pointer)local_178,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd28,file,(size_t)line_num,
               (const_string *)in_stack_fffffffffffffd10);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffcf8,SUB81((ulong)local_178 >> 0x38,0));
    in_stack_fffffffffffffd10 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,(pointer)local_178,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(local_178,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,(pointer)local_178,
               (unsigned_long)this_00);
    this_00 = (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b8,local_1d8,(const_string *)&stack0xfffffffffffffe08,0x4cf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Span<const_std::byte>::Span((Span<const_std::byte> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffcf8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_178);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffcf8,(difference_type)local_178);
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffcf8,(difference_type)local_178);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffcf8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_178);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd10,
             __first,__last);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<uint8_t> ReceivePacket(Span<const std::byte> aad = {})
    {
        std::vector<uint8_t> contents;
        // Loop as long as there are ignored packets that are to be skipped.
        while (true) {
            // When processing a packet, at least enough bytes for its length descriptor must be received.
            BOOST_REQUIRE(m_received.size() >= BIP324Cipher::LENGTH_LEN);
            // Decrypt the content length.
            size_t size = m_cipher.DecryptLength(MakeByteSpan(Span{m_received}.first(BIP324Cipher::LENGTH_LEN)));
            // Check that the full packet is in the receive buffer.
            BOOST_REQUIRE(m_received.size() >= size + BIP324Cipher::EXPANSION);
            // Decrypt the packet contents.
            contents.resize(size);
            bool ignore{false};
            bool ret = m_cipher.Decrypt(
                /*input=*/MakeByteSpan(
                    Span{m_received}.first(size + BIP324Cipher::EXPANSION).subspan(BIP324Cipher::LENGTH_LEN)),
                /*aad=*/aad,
                /*ignore=*/ignore,
                /*contents=*/MakeWritableByteSpan(contents));
            BOOST_CHECK(ret);
            // Don't expect AAD in further packets.
            aad = {};
            // Strip the processed packet's bytes off the front of the receive buffer.
            m_received.erase(m_received.begin(), m_received.begin() + size + BIP324Cipher::EXPANSION);
            // Stop if the ignore bit is not set on this packet.
            if (!ignore) break;
        }
        return contents;
    }